

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

int __thiscall glslang::TScanContext::secondGenerationImage(TScanContext *this)

{
  EProfile EVar1;
  TParseContextBase *pTVar2;
  int iVar3;
  
  pTVar2 = this->parseContext;
  EVar1 = (pTVar2->super_TParseVersions).profile;
  if ((EVar1 == EEsProfile) && (0x135 < (pTVar2->super_TParseVersions).version)) {
    reservedWord(this);
  }
  else if ((3 < (int)((ulong)((long)(pTVar2->symbolTable->table).
                                    super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar2->symbolTable->table).
                                   super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
          ((EVar1 == EEsProfile ||
           (((pTVar2->super_TParseVersions).version < 0x1a4 &&
            (iVar3 = (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[8])
                               (pTVar2,"GL_ARB_shader_image_load_store"), (char)iVar3 == '\0'))))))
  {
    pTVar2 = this->parseContext;
    if ((pTVar2->super_TParseVersions).forwardCompatible == true) {
      (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x2e])
                (pTVar2,&this->loc,"using future type keyword",this->tokenText,"");
    }
    iVar3 = identifierOrType(this);
    return iVar3;
  }
  return this->keyword;
}

Assistant:

int TScanContext::secondGenerationImage()
{
    if (parseContext.isEsProfile() && parseContext.version >= 310) {
        reservedWord();
        return keyword;
    }

    if (parseContext.symbolTable.atBuiltInLevel() ||
        (!parseContext.isEsProfile() &&
         (parseContext.version >= 420 || parseContext.extensionTurnedOn(E_GL_ARB_shader_image_load_store))))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}